

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O2

result_t * exttposeFunc(result_t *__return_storage_ptr__,Env *env,ExttposeArgument *args)

{
  ostringstream *poVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  string asStack_198 [32];
  Exttpose exttpose;
  
  poVar1 = &env->logger;
  poVar2 = std::operator<<((ostream *)poVar1,"CONF ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,args->DBASE_NUM_TRANS);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,args->DBASE_MAXITEM);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,args->DBASE_AVG_TRANS_SZ);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,args->DBASE_AVG_CUST_SZ);
  std::endl<char,std::char_traits<char>>(poVar2);
  if (args->use_diff != '\0') {
    std::operator<<((ostream *)poVar1,"SEQ TURNED OFF and PARTITIONS = 1\n");
  }
  lVar3 = lround((double)args->DBASE_NUM_TRANS * args->MINSUP_PER + 0.5);
  lVar4 = 1;
  if (1 < lVar3) {
    lVar4 = lVar3;
  }
  if (args->write_only_fcnt != 0) {
    lVar4 = lVar3;
  }
  args->MINSUPPORT = lVar4;
  poVar2 = std::operator<<((ostream *)poVar1,"args.MINSUPPORT ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,args->DBASE_NUM_TRANS);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar1 = &env->summary;
  std::operator<<((ostream *)poVar1,"TPOSE");
  if (args->use_diff != '\0') {
    std::operator<<((ostream *)poVar1," DIFF");
  }
  if (args->use_seq != 0) {
    std::operator<<((ostream *)poVar1," SEQ");
  }
  if (args->do_invert == 0) {
    std::operator<<((ostream *)poVar1," NOINVERT");
  }
  if (args->do_l2 == 0) {
    std::operator<<((ostream *)poVar1," NOF2");
  }
  poVar2 = std::operator<<((ostream *)poVar1," ");
  poVar2 = std::operator<<(poVar2,(string *)args);
  std::operator<<(poVar2," ");
  poVar2 = std::ostream::_M_insert<double>(args->MINSUP_PER);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,args->DBASE_NUM_TRANS);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2," ");
  std::ostream::operator<<(poVar2,args->num_partitions);
  Exttpose::Exttpose(&exttpose,env,args);
  Exttpose::tpose(&exttpose);
  result_t::result_t(__return_storage_ptr__);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->logger,asStack_198);
  std::__cxx11::string::~string(asStack_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->summary,asStack_198);
  std::__cxx11::string::~string(asStack_198);
  Exttpose::~Exttpose(&exttpose);
  return __return_storage_ptr__;
}

Assistant:

result_t exttposeFunc(Env &env, ExttposeArgument &args) {
    env.logger << "CONF " << args.DBASE_NUM_TRANS << " " << args.DBASE_MAXITEM << " "
               << args.DBASE_AVG_TRANS_SZ << " " << args.DBASE_AVG_CUST_SZ << endl;

    if (args.use_diff) {
        env.logger << "SEQ TURNED OFF and PARTITIONS = 1\n";
    }

    args.MINSUPPORT = lround(args.MINSUP_PER * args.DBASE_NUM_TRANS + 0.5);

    //ensure that support is at least 2
    if (!args.write_only_fcnt && args.MINSUPPORT < 1) args.MINSUPPORT = 1;
    env.logger << "args.MINSUPPORT " << args.MINSUPPORT << " " << args.DBASE_NUM_TRANS << endl;

    env.summary << "TPOSE";
    if (args.use_diff) env.summary << " DIFF";
    if (args.use_seq) env.summary << " SEQ";
    if (!args.do_invert) env.summary << " NOINVERT";
    if (!args.do_l2) env.summary << " NOF2";
    env.summary << " " << args.input << " " << args.MINSUP_PER << " " << args.DBASE_NUM_TRANS << " "
                << args.MINSUPPORT << " " << args.num_partitions;

    Exttpose exttpose(env, args);
    exttpose.tpose();

    result_t result;
    result.logger = env.logger.str();
    result.summary = env.summary.str();
    return result;
}